

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O2

string * __thiscall
mnf::SO3<mnf::ExpMapMatrix>::toString
          (string *__return_storage_ptr__,SO3<mnf::ExpMapMatrix> *this,ConstRefVec *val,
          string *prefix,IOFormat *fmt)

{
  ostream *s;
  string matPrefix;
  stringstream ss;
  ostream local_298 [376];
  WithFormat<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
  local_120;
  
  std::operator+(&matPrefix,prefix,'[');
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  s = std::operator<<(local_298,(string *)&matPrefix);
  local_120.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (val->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_data;
  Eigen::IOFormat::IOFormat(&local_120.m_format,fmt);
  Eigen::operator<<(s,&local_120);
  Eigen::IOFormat::~IOFormat(&local_120.m_format);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&matPrefix);
  return __return_storage_ptr__;
}

Assistant:

inline std::string SO3<Map>::toString(const ConstRefVec& val,
                                      const std::string& prefix,
                                      const Eigen::IOFormat& fmt) const
{
  std::string matPrefix = prefix + '[';
  std::stringstream ss;
  ss << matPrefix
     << (Eigen::Map<const typename Map::DisplayType>(val.data())).format(fmt);
  return ss.str();
}